

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::ConstructMessageRecursive<long,unsigned_long>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,long param,unsigned_long params)

{
  ExceptionFormatValue local_60;
  
  duckdb::ExceptionFormatValue::ExceptionFormatValue(&local_60,(long)values);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.str_val._M_dataplus._M_p != &local_60.str_val.field_2) {
    operator_delete(local_60.str_val._M_dataplus._M_p);
  }
  ConstructMessageRecursive<unsigned_long>
            (__return_storage_ptr__,(string *)this,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,param);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}